

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::php::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  size_t __n;
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  iVar1 = std::__cxx11::string::compare((char *)parameter);
  if (iVar1 == 0) {
    __n = (*(undefined8 **)file)[1];
    if ((__n == kDescriptorFile_abi_cxx11_._M_string_length) &&
       ((__n == 0 ||
        (iVar2 = bcmp((void *)**(undefined8 **)file,kDescriptorFile_abi_cxx11_._M_dataplus._M_p,__n)
        , iVar2 == 0)))) goto LAB_0023b865;
    pcVar4 = (char *)error->_M_string_length;
    pcVar3 = "Can only generate PHP code for google/protobuf/descriptor.proto.\n";
  }
  else {
    if (*(int *)(file + 0x8c) == 3) {
LAB_0023b865:
      GenerateFile(file,iVar1 == 0,generator_context);
      return true;
    }
    pcVar4 = (char *)error->_M_string_length;
    pcVar3 = 
    "Can only generate PHP code for proto3 .proto files.\nPlease add \'syntax = \"proto3\";\' to the top of your .proto file.\n"
    ;
  }
  std::__cxx11::string::_M_replace((ulong)error,0,pcVar4,(ulong)pcVar3);
  return false;
}

Assistant:

bool Generator::Generate(const FileDescriptor* file, const string& parameter,
                         GeneratorContext* generator_context,
                         string* error) const {
  bool is_descriptor = parameter == "internal";

  if (is_descriptor && file->name() != kDescriptorFile) {
    *error =
        "Can only generate PHP code for google/protobuf/descriptor.proto.\n";
    return false;
  }

  if (!is_descriptor && file->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    *error =
        "Can only generate PHP code for proto3 .proto files.\n"
        "Please add 'syntax = \"proto3\";' to the top of your .proto file.\n";
    return false;
  }

  GenerateFile(file, is_descriptor, generator_context);

  return true;
}